

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.hpp
# Opt level: O3

void Arguments::declare(bool *ref,char *helpText,char *longTrigger,char *shortTrigger)

{
  Descriptor *this;
  BaseAction *action;
  Core *this_00;
  char *s;
  String SStack_58;
  String local_48;
  ROString local_38;
  
  this = (Descriptor *)operator_new(0x38);
  local_38.data = helpText;
  local_38.length = Strings::findLength(helpText,0);
  s = "";
  if (shortTrigger != (char *)0x0) {
    s = shortTrigger;
  }
  Bstrlib::String::String(&local_48,s);
  Bstrlib::String::String(&SStack_58,longTrigger);
  Descriptor::Descriptor(this,&local_38,&local_48,&SStack_58,0);
  Bstrlib::String::~String(&SStack_58);
  Bstrlib::String::~String(&local_48);
  action = (BaseAction *)operator_new(0x18);
  action->_vptr_BaseAction = (_func_int **)&PTR_match_0012e108;
  action[1]._vptr_BaseAction = (_func_int **)ref;
  this_00 = Core::getInstance();
  Core::internalReg(this_00,this,action);
  return;
}

Assistant:

inline void declare(bool & ref, const char * helpText, const char * longTrigger, const char * shortTrigger = 0)
    {
        // First create the descriptor
        Descriptor * desc = new Descriptor(helpText, shortTrigger ? shortTrigger : "", longTrigger, 0);
        Core::registerDescriptorAndAction(desc, new RefAction<bool>(ref));
    }